

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qurlquery.cpp
# Opt level: O0

void __thiscall
QUrlQuery::setQueryDelimiters(QUrlQuery *this,QChar valueDelimiter,QChar pairDelimiter)

{
  long lVar1;
  QUrlQueryPrivate *pQVar2;
  char16_t in_DX;
  char16_t in_SI;
  QSharedDataPointer<QUrlQueryPrivate> *in_RDI;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = QSharedDataPointer<QUrlQueryPrivate>::operator->(in_RDI);
  (pQVar2->valueDelimiter).ucs = in_SI;
  pQVar2 = QSharedDataPointer<QUrlQueryPrivate>::operator->(in_RDI);
  (pQVar2->pairDelimiter).ucs = in_DX;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QUrlQuery::setQueryDelimiters(QChar valueDelimiter, QChar pairDelimiter)
{
    d->valueDelimiter = valueDelimiter;
    d->pairDelimiter = pairDelimiter;
}